

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2point_region.h
# Opt level: O0

void __thiscall S2PointRegion::S2PointRegion(S2PointRegion *this,S2Point *point)

{
  VType VVar1;
  bool bVar2;
  ostream *poVar3;
  S2LogMessage local_38;
  S2LogMessageVoidify local_25 [13];
  S2Point *local_18;
  S2Point *point_local;
  S2PointRegion *this_local;
  
  local_18 = point;
  point_local = (S2Point *)this;
  S2Region::S2Region(&this->super_S2Region);
  (this->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2PointRegion_0062e9e0;
  (this->point_).c_[2] = local_18->c_[2];
  VVar1 = local_18->c_[1];
  (this->point_).c_[0] = local_18->c_[0];
  (this->point_).c_[1] = VVar1;
  bVar2 = S2::IsUnitLength(local_18);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    return;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2point_region.h"
             ,0x49,kFatal,(ostream *)&std::cerr);
  poVar3 = S2LogMessage::stream(&local_38);
  poVar3 = std::operator<<(poVar3,"Check failed: S2::IsUnitLength(point) ");
  S2LogMessageVoidify::operator&(local_25,poVar3);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_38);
}

Assistant:

inline S2PointRegion::S2PointRegion(const S2Point& point) : point_(point) {
  S2_DCHECK(S2::IsUnitLength(point));
}